

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ll_node * ll_create_node(void *ptr,size_t isize)

{
  void *pvVar1;
  ll_node *node;
  size_t isize_local;
  void *ptr_local;
  
  if ((ptr == (void *)0x0) || (isize == 0)) {
    ptr_local = (void *)0x0;
  }
  else {
    ptr_local = xmalloc(0x18);
    *(undefined8 *)((long)ptr_local + 0x10) = 0;
    pvVar1 = xmalloc(isize);
    *(void **)ptr_local = pvVar1;
    *(size_t *)((long)ptr_local + 8) = isize;
    memcpy(*ptr_local,ptr,isize);
  }
  return (ll_node *)ptr_local;
}

Assistant:

struct ll_node *ll_create_node(const void *ptr, size_t isize)
{
	if (ptr == NULL || isize <= 0) {
		return NULL;
	}
	struct ll_node *node = xmalloc(sizeof(struct ll_node));
	node->next = NULL;
	node->value_ptr = xmalloc(isize);
	node->value_size = isize;
	memcpy(node->value_ptr, ptr, isize);
	return node;
}